

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManCountMapRefsOne(Lf_Man_t *p,int iObj)

{
  Jf_Par_t *pJVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Lf_Bst_t *pLVar5;
  Lf_Cut_t *pCut;
  ulong uVar6;
  float fVar7;
  
  pLVar5 = Lf_ObjReadBest(p,iObj);
  pCut = Lf_ObjCutBest(p,iObj);
  iVar2 = Vec_IntEntry(&p->vRequired,iObj);
  iVar3 = Lf_ObjMapRefNum(p,iObj);
  if (iVar3 < 1) {
    __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x62e,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
  }
  if ((((uint)pLVar5->Cut[1] ^ (uint)pLVar5->Cut[0]) & 1) != 0) {
    uVar4 = *(uint *)&pCut->field_0x14;
    if ((uVar4 >> 0x17 & 1) == 0) {
      for (uVar6 = 0; uVar4 = uVar4 >> 0x18, uVar6 < uVar4; uVar6 = uVar6 + 1) {
        Lf_ObjSetRequired(p,*(int *)((long)&pCut[1].Sign + uVar6 * 4),iVar2 + -1);
        uVar4 = *(uint *)&pCut->field_0x14;
      }
      if ((p->vSwitches).nSize != 0) {
        fVar7 = Lf_CutSwitches(p,pCut);
        p->Switches = (double)fVar7 + p->Switches;
        uVar4 = (uint)(byte)pCut->field_0x17;
      }
      pJVar1 = p->pPars;
      pJVar1->Area = pJVar1->Area + 1;
      pJVar1->Edge = (ulong)uVar4 + pJVar1->Edge;
      return;
    }
    __assert_fail("!pCut->fMux7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x630,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
  }
  __assert_fail("Lf_BestIsMapped(pBest)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x62f,"void Lf_ManCountMapRefsOne(Lf_Man_t *, int)");
}

Assistant:

void Lf_ManCountMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    Lf_Cut_t * pCut = Lf_ObjCutBest( p, iObj );
    int k ,Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( Lf_BestIsMapped(pBest) );
    assert( !pCut->fMux7 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}